

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O2

void __thiscall cursespp::TextInput::~TextInput(TextInput *this)

{
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__TextInput_001c1b70;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__TextInput_001c1d80;
  (this->super_Window).super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__TextInput_001c1db0;
  (this->super_Window).super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__TextInput_001c1dd8;
  (this->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)&PTR__TextInput_001c1e00;
  (this->super_IInput)._vptr_IInput = (_func_int **)&PTR__TextInput_001c1e28;
  std::__cxx11::string::~string((string *)&this->hintText);
  std::__cxx11::string::~string((string *)&this->buffer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->rawBlacklist);
  sigslot::
  signal2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  ::~signal2(&this->TextChanged);
  sigslot::signal1<cursespp::TextInput_*,_sigslot::multi_threaded_local>::~signal1
            (&this->EnterPressed);
  Window::~Window(&this->super_Window);
  return;
}

Assistant:

TextInput::~TextInput() {
}